

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::GetTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,Type *type)

{
  char *__s;
  FullType FVar1;
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  RustGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (RustGenerator *)__return_storage_ptr__;
  FVar1 = anon_unknown_26::GetFullType(type);
  if ((ftBool < FVar1) && (FVar1 != ftEnumKey && FVar1 != ftUnionKey)) {
    __assert_fail("false && \"incorrect type given\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x262,
                  "std::string flatbuffers::rust::RustGenerator::GetTypeBasic(const Type &) const");
  }
  if (local_20->enum_def == (EnumDef *)0x0) {
    __s = GetTypeBasic::ctypename[local_20->base_type];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    WrapInNameSpace_abi_cxx11_(__return_storage_ptr__,this,&local_20->enum_def->super_Definition);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeBasic(const Type &type) const {
    switch (GetFullType(type)) {
      case ftInteger:
      case ftFloat:
      case ftBool:
      case ftEnumKey:
      case ftUnionKey: {
        break;
      }
      default: {
        FLATBUFFERS_ASSERT(false && "incorrect type given");
      }
    }

    // clang-format off
    static const char * const ctypename[] = {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, \
                           RTYPE, ...) \
      #RTYPE,
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    };
    // clang-format on

    if (type.enum_def) { return WrapInNameSpace(*type.enum_def); }
    return ctypename[type.base_type];
  }